

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int getIDWithAttrMask(uint16_t *instructionID,InternalInstruction *insn,uint16_t attrMask)

{
  InstrUID IVar1;
  int iVar2;
  uint16_t in_DX;
  long in_RSI;
  InstrUID *in_RDI;
  InstructionContext instructionClass;
  _Bool hasModRMExtension;
  InstructionContext local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(char *)(in_RSI + 0xf5) == '\x0e') && (*(int *)(in_RSI + 0xf8) == 7)) {
    *in_RDI = 0x301;
  }
  else {
    if (*(int *)(in_RSI + 0xf8) == 7) {
      local_20 = IC_OF;
    }
    else {
      local_20 = contextForAttrs(in_DX);
    }
    iVar2 = modRMRequired(*(OpcodeType *)(in_RSI + 0xf8),local_20,(ushort)*(byte *)(in_RSI + 0xf5));
    if (iVar2 == 0) {
      IVar1 = decode(*(OpcodeType *)(in_RSI + 0xf8),local_20,*(uint8_t *)(in_RSI + 0xf5),'\0');
      *in_RDI = IVar1;
    }
    else {
      iVar2 = readModRM((InternalInstruction *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar2 != 0) {
        return -1;
      }
      IVar1 = decode(*(OpcodeType *)(in_RSI + 0xf8),local_20,*(uint8_t *)(in_RSI + 0xf5),
                     *(uint8_t *)(in_RSI + 0x110));
      *in_RDI = IVar1;
    }
  }
  return 0;
}

Assistant:

static int getIDWithAttrMask(uint16_t *instructionID,
		struct InternalInstruction *insn,
		uint16_t attrMask)
{
	bool hasModRMExtension;

	InstructionContext instructionClass;

#ifndef CAPSTONE_X86_REDUCE
	// HACK for femms. to be handled properly in next version 3.x
	if (insn->opcode == 0x0e && insn->opcodeType == T3DNOW_MAP) {
		*instructionID = X86_FEMMS;
		return 0;
	}
#endif

	if (insn->opcodeType == T3DNOW_MAP)
		instructionClass = IC_OF;
	else
		instructionClass = contextForAttrs(attrMask);

	hasModRMExtension = modRMRequired(insn->opcodeType,
			instructionClass,
			insn->opcode) != 0;

	if (hasModRMExtension) {
		if (readModRM(insn))
			return -1;

		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				insn->modRM);
	} else {
		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				0);
	}

	return 0;
}